

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseBlockExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t sVar3;
  char *pcVar4;
  sysbvm_tuple_t sVar5;
  bool bVar6;
  size_t sVar7;
  sysbvm_tuple_t sVar8;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_40;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 != 0xd) {
    sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    pcVar4 = "Expected a left curly bracket.";
    goto LAB_0012eca9;
  }
  startIndex = state->tokenPosition;
  state->tokenPosition = startIndex + 1;
  sVar3 = 0;
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  local_40 = 0xb;
  if (iVar1 == 0x12) {
    sVar3 = 0;
    bVar6 = false;
    do {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 == 0x12) {
        sVar7 = state->tokenPosition;
        state->tokenPosition = sVar7 + 1;
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        sVar8 = 0xf;
        if (iVar1 == 0x11) {
          state->tokenPosition = state->tokenPosition + 1;
          sVar8 = 0x1f;
        }
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        sVar5 = 0;
        if (iVar1 == 9) {
          state->tokenPosition = state->tokenPosition + 1;
          sVar5 = sysbvm_parser_parseCommaExpression(context,state);
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          if (iVar1 == 10) {
            state->tokenPosition = state->tokenPosition + 1;
            goto LAB_0012ea2b;
          }
          sVar8 = sysbvm_parser_makeSourcePositionForParserState(context,state);
          pcVar4 = "Expected a right parentheses that specifies the type.";
        }
        else {
LAB_0012ea2b:
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          if (iVar1 == 2) {
            sVar2 = sysbvm_parser_parseLiteralTokenValue(context,state);
            sourcePosition =
                 sysbvm_parser_makeSourcePositionForTokenRange
                           (context,state->sourceCode,state->tokenSequence,sVar7,
                            state->tokenPosition);
            sVar8 = sysbvm_astArgumentNode_create(context,sourcePosition,sVar8,sVar2,sVar5);
            goto LAB_0012ead9;
          }
          sVar8 = sysbvm_parser_makeSourcePositionForParserState(context,state);
          pcVar4 = "Expected an identifier with the argument name.";
        }
        sVar8 = sysbvm_astErrorNode_createWithCString(context,sVar8,pcVar4);
      }
      else {
        sVar8 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        sVar8 = sysbvm_astErrorNode_createWithCString
                          (context,sVar8,"Expected a colon to delimit a block argument.");
      }
LAB_0012ead9:
      if (!bVar6) {
        sVar3 = sysbvm_orderedCollection_create(context);
        bVar6 = true;
      }
      sysbvm_orderedCollection_add(context,sVar3,sVar8);
      iVar1 = sysbvm_parser_lookKindAt(state,0);
    } while (iVar1 == 0x12);
    if ((bVar6) && (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 0x19)) {
      state->tokenPosition = state->tokenPosition + 1;
      local_40 = 0x2b;
    }
  }
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0x13) {
    state->tokenPosition = state->tokenPosition + 1;
    local_50 = sysbvm_parser_parseUnaryExpression(context,state);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 != 0x14) {
      sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
      pcVar4 = "Expected a lambda block back.";
      goto LAB_0012eca9;
    }
LAB_0012eba1:
    sVar7 = state->tokenPosition + 1;
    state->tokenPosition = sVar7;
    bVar6 = true;
  }
  else {
    local_50 = 0;
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0x14) goto LAB_0012eba1;
    sVar7 = state->tokenPosition;
    bVar6 = false;
    local_50 = 0;
  }
  sVar8 = sysbvm_parser_parsePragmaList(context,state);
  sVar5 = sysbvm_parser_parseExpressionListUntil(context,state,SYSBVM_TOKEN_KIND_RCBRACKET);
  sVar2 = sysbvm_parser_makeSourcePositionForTokenRange
                    (context,state->sourceCode,state->tokenSequence,sVar7,state->tokenPosition);
  sVar8 = sysbvm_astSequenceNode_create(context,sVar2,sVar8,sVar5);
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0xe) {
    sVar7 = state->tokenPosition + 1;
    state->tokenPosition = sVar7;
    sVar5 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,startIndex,sVar7);
    if (!bVar6) {
      sVar3 = sysbvm_astLexicalBlockNode_create(context,sVar5,sVar8);
      return sVar3;
    }
    if (sVar3 == 0) {
      sVar3 = sysbvm_orderedCollection_create(context);
    }
    sVar3 = sysbvm_orderedCollection_asArray(context,sVar3);
    sVar3 = sysbvm_astLambdaNode_create(context,sVar5,local_40,sVar3,local_50,sVar8);
    return sVar3;
  }
  sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
  pcVar4 = "Expected a right curly bracket.";
LAB_0012eca9:
  sVar3 = sysbvm_astErrorNode_createWithCString(context,sVar3,pcVar4);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseBlockExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
   if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_LCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a left curly bracket.");

    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t argumentList = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t resultTypeExpression = SYSBVM_NULL_TUPLE;
    bool hasArguments = false;
    bool hasEllipsis = false;
    bool hasResultType = false;
    bool hasBlockBar = false;
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON)
    {
        sysbvm_tuple_t argument = sysbvm_parser_parseBlockArgument(context, state);

        if(!hasArguments)
        {
            argumentList = sysbvm_orderedCollection_create(context);
            hasArguments = true;
        }

        sysbvm_orderedCollection_add(context, argumentList, argument);
    }

    if(hasArguments && sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_ELLIPSIS)
    {
        hasEllipsis = true;
        ++state->tokenPosition;
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON_COLON)
    {
        ++state->tokenPosition;
        hasResultType = true;
        resultTypeExpression = sysbvm_parser_parseUnaryExpression(context, state);
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_BAR)
    {
        hasBlockBar = true;
        ++state->tokenPosition;
    }

    if((hasBlockBar || hasResultType) && !hasBlockBar)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a lambda block back.");

    bool isLambda = hasBlockBar;

    sysbvm_tuple_t sequenceNode = sysbvm_parser_parseSequenceUntil(context, state, SYSBVM_TOKEN_KIND_RCBRACKET);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right curly bracket.");

    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);

    if(isLambda)
    {
        if(!argumentList)
            argumentList = sysbvm_orderedCollection_create(context);

        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(hasEllipsis ? SYSBVM_FUNCTION_FLAGS_VARIADIC : SYSBVM_FUNCTION_FLAGS_NONE);
        return sysbvm_astLambdaNode_create(context, sourcePosition, flags,
            sysbvm_orderedCollection_asArray(context, argumentList),
            resultTypeExpression, sequenceNode);
    }
    else
    {
        return sysbvm_astLexicalBlockNode_create(context, sourcePosition, sequenceNode);
    }
}